

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gest_features.cpp
# Opt level: O3

bool __thiscall
Am_Feature_Vector_Data::operator==(Am_Feature_Vector_Data *this,Am_Wrapper *test_value)

{
  Am_ID_Tag AVar1;
  int iVar2;
  
  AVar1 = id;
  iVar2 = (**(test_value->super_Am_Registered_Type)._vptr_Am_Registered_Type)(test_value);
  return (Am_Feature_Vector_Data *)test_value == this && AVar1 == (Am_ID_Tag)iVar2;
}

Assistant:

Am_Feature_Vector_Data::Am_Feature_Vector_Data()
{
  int i;

  y = NewVector(NFEATURES);

  npoints = 0;
  initial_sin = initial_cos = 0.0;
  path_r = 0;
  path_th = 0;
  abs_th = 0;
  sharpness = 0;
  for (i = 0; i < NFEATURES; i++)
    y[i] = 0.0;
  calculated = false;
}